

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferCache.cpp
# Opt level: O0

void __thiscall Diligent::FramebufferCache::~FramebufferCache(FramebufferCache *this)

{
  bool bVar1;
  Char *pCVar2;
  undefined1 local_70 [8];
  string msg_2;
  string msg_1;
  string msg;
  FramebufferCache *this_local;
  
  bVar1 = std::
          unordered_map<Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>,_Diligent::FramebufferCache::FramebufferCacheKeyHash,_std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,_std::allocator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>_>_>
          ::empty(&this->m_Cache);
  if (!bVar1) {
    FormatString<char[34]>
              ((string *)((long)&msg_1.field_2 + 8),
               (char (*) [34])"All framebuffers must be released");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"~FramebufferCache",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FramebufferCache.cpp"
               ,0xc1);
    std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
  }
  bVar1 = std::
          unordered_multimap<VkImageView_T_*,_Diligent::FramebufferCache::FramebufferCacheKey,_std::hash<VkImageView_T_*>,_std::equal_to<VkImageView_T_*>,_std::allocator<std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>_>
          ::empty(&this->m_ViewToKeyMap);
  if (!bVar1) {
    FormatString<char[64]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [64])"All image views must be released and the cache must be notified");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"~FramebufferCache",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FramebufferCache.cpp"
               ,0xc2);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  bVar1 = std::
          unordered_multimap<VkRenderPass_T_*,_Diligent::FramebufferCache::FramebufferCacheKey,_std::hash<VkRenderPass_T_*>,_std::equal_to<VkRenderPass_T_*>,_std::allocator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>_>
          ::empty(&this->m_RenderPassToKeyMap);
  if (!bVar1) {
    FormatString<char[66]>
              ((string *)local_70,
               (char (*) [66])"All render passes must be released and the cache must be notified");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"~FramebufferCache",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FramebufferCache.cpp"
               ,0xc3);
    std::__cxx11::string::~string((string *)local_70);
  }
  std::
  unordered_multimap<VkRenderPass_T_*,_Diligent::FramebufferCache::FramebufferCacheKey,_std::hash<VkRenderPass_T_*>,_std::equal_to<VkRenderPass_T_*>,_std::allocator<std::pair<VkRenderPass_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>_>
  ::~unordered_multimap(&this->m_RenderPassToKeyMap);
  std::
  unordered_multimap<VkImageView_T_*,_Diligent::FramebufferCache::FramebufferCacheKey,_std::hash<VkImageView_T_*>,_std::equal_to<VkImageView_T_*>,_std::allocator<std::pair<VkImageView_T_*const,_Diligent::FramebufferCache::FramebufferCacheKey>_>_>
  ::~unordered_multimap(&this->m_ViewToKeyMap);
  std::
  unordered_map<Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>,_Diligent::FramebufferCache::FramebufferCacheKeyHash,_std::equal_to<Diligent::FramebufferCache::FramebufferCacheKey>,_std::allocator<std::pair<const_Diligent::FramebufferCache::FramebufferCacheKey,_VulkanUtilities::VulkanObjectWrapper<VkFramebuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)13>_>_>_>
  ::~unordered_map(&this->m_Cache);
  return;
}

Assistant:

FramebufferCache::~FramebufferCache()
{
    VERIFY(m_Cache.empty(), "All framebuffers must be released");
    VERIFY(m_ViewToKeyMap.empty(), "All image views must be released and the cache must be notified");
    VERIFY(m_RenderPassToKeyMap.empty(), "All render passes must be released and the cache must be notified");
}